

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O2

Abc_Ntk_t * Io_ReadDsd(char *pForm)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pAVar4;
  size_t sVar5;
  char *pcVar6;
  Abc_Obj_t *pObj;
  byte bVar7;
  uint uVar8;
  int iVar9;
  Abc_Ntk_t *pAVar10;
  
  uVar8 = 0;
  for (pcVar3 = pForm; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    bVar7 = *pcVar3 + 0x9f;
    uVar2 = (uint)bVar7;
    if (bVar7 < uVar8) {
      uVar2 = uVar8;
    }
    if (bVar7 < 0x1a) {
      uVar8 = uVar2;
    }
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar3 = Extra_UtilStrsav("dsd");
  pNtk->pName = pcVar3;
  vNames = Abc_NodeGetFakeNames(uVar8 + 1);
  for (iVar9 = 0; iVar9 <= (int)uVar8; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    pcVar3 = (char *)Vec_PtrEntry(vNames,iVar9);
    Abc_ObjAssignName(pAVar4,pcVar3,(char *)0x0);
  }
  Abc_NodeFreeNames(vNames);
  sVar5 = strlen(pForm);
  pcVar3 = (char *)malloc(sVar5 * 3 + 10);
  *pcVar3 = '(';
  pcVar6 = pcVar3 + 1;
  do {
    cVar1 = *pForm;
    if (cVar1 == '(') {
      pcVar6[0] = '(';
      pcVar6[1] = '(';
LAB_00299a62:
      pcVar6 = pcVar6 + 2;
    }
    else {
      if (cVar1 == ')') {
        pcVar6[0] = ')';
        pcVar6[1] = ')';
        goto LAB_00299a62;
      }
      if (cVar1 == ',') {
        pcVar6[0] = ')';
        pcVar6[1] = ',';
        pcVar6[2] = '(';
        pcVar6 = pcVar6 + 3;
      }
      else {
        if (cVar1 == '\0') {
          pcVar6[0] = ')';
          pcVar6[1] = '\0';
          pAVar4 = Io_ReadDsd_rec(pNtk,pcVar3,(char *)0x0);
          free(pcVar3);
          pAVar10 = (Abc_Ntk_t *)0x0;
          if (pAVar4 != (Abc_Obj_t *)0x0) {
            pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
            Abc_ObjAssignName(pObj,"F",(char *)0x0);
            Abc_ObjAddFanin(pObj,pAVar4);
            iVar9 = Abc_NtkCheck(pNtk);
            pAVar10 = pNtk;
            if (iVar9 == 0) {
              fwrite("Io_ReadDsd(): Network check has failed.\n",0x28,1,_stdout);
              Abc_NtkDelete(pNtk);
              pAVar10 = (Abc_Ntk_t *)0x0;
            }
          }
          return pAVar10;
        }
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      }
    }
    pForm = pForm + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Io_ReadDsd( char * pForm )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pTop;
    Vec_Ptr_t * vNames;
    char * pCur, * pFormCopy;
    int i, nInputs;

    // count the number of elementary variables
    nInputs = 0;
    for ( pCur = pForm; *pCur; pCur++ )
        if ( *pCur >= 'a' && *pCur <= 'z' )
            nInputs = Abc_MaxInt( nInputs, *pCur - 'a' );
    nInputs++;

    // create the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "dsd" );

    // create PIs
    vNames = Abc_NodeGetFakeNames( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );

    // transform the formula by inserting parentheses
    // this transforms strings like PRIME(a,b,cd) into (PRIME((a),(b),(cd)))
    pCur = pFormCopy = ABC_ALLOC( char, 3 * strlen(pForm) + 10 );
    *pCur++ = '(';
    for ( ; *pForm; pForm++ )
        if ( *pForm == '(' )
        {
            *pCur++ = '(';
            *pCur++ = '(';
        }
        else if ( *pForm == ')' )
        {
            *pCur++ = ')';
            *pCur++ = ')';
        }
        else if ( *pForm == ',' )
        {
            *pCur++ = ')';
            *pCur++ = ',';
            *pCur++ = '(';
        }
        else
            *pCur++ = *pForm;
    *pCur++ = ')';
    *pCur = 0;

    // parse the formula
    pObj = Io_ReadDsd_rec( pNtk, pFormCopy, NULL );
    ABC_FREE( pFormCopy );
    if ( pObj == NULL )
        return NULL;

    // create output
    pTop = Abc_NtkCreatePo(pNtk);
    Abc_ObjAssignName( pTop, "F", NULL );
    Abc_ObjAddFanin( pTop, pObj );

    // create the only PO
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Io_ReadDsd(): Network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}